

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElHCurl.cpp
# Opt level: O1

void __thiscall
TPZCompElHCurl<pzshape::TPZShapeLinear>::SideShapeFunction
          (TPZCompElHCurl<pzshape::TPZShapeLinear> *this,int side,TPZVec<double> *point,
          TPZFMatrix<double> *phi,TPZFMatrix<double> *curlphi)

{
  bool bVar1;
  REAL RVar2;
  TPZFMatrix<double> *phi_00;
  TPZFMatrix<double> *this_00;
  int iVar3;
  MElementType MVar4;
  undefined4 uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  TPZGeoEl *this_01;
  TPZGeoNode *pTVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  REAL detjac;
  TPZManVector<long,_2> ids;
  TPZManVector<int,_3> ordHCurl;
  TPZGeoElSide gelside;
  TPZFMatrix<double> curlphiref;
  TPZFMatrix<double> phiref;
  TPZFNMatrix<9,_double> jacinv;
  TPZFNMatrix<9,_double> jac;
  TPZFNMatrix<9,_double> axes;
  TPZShapeData shapedata;
  REAL local_3d78;
  TPZManVector<long,_2> local_3d70;
  TPZManVector<int,_3> local_3d40;
  undefined8 local_3d10;
  TPZFMatrix<double> *local_3d08;
  TPZFMatrix<double> *local_3d00;
  TPZGeoElSide local_3cf8;
  TPZFMatrix<double> local_3ce0;
  TPZFMatrix<double> local_3c50;
  TPZFMatrix<double> local_3bc0;
  double local_3b30 [10];
  TPZFMatrix<double> local_3ae0;
  double local_3a50 [10];
  TPZFMatrix<double> local_3a00;
  double local_3970 [10];
  TPZShapeData local_3920;
  
  local_3d08 = phi;
  local_3d00 = curlphi;
  iVar3 = pztopology::TPZLine::SideDimension(side);
  MVar4 = pztopology::TPZLine::Type(side);
  uVar5 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeLinear>).
                                 super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                 super_TPZCompEl + 0x310))(this,side);
  (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeLinear>).
                         super_TPZInterpolatedElement.super_TPZInterpolationSpace.super_TPZCompEl +
              0xa8))(this,uVar5);
  iVar6 = pztopology::TPZLine::NContainedSides(side);
  uVar7 = pztopology::TPZLine::NSideNodes(side);
  local_3920._0_4_ = 0xffffffff;
  TPZManVector<int,_3>::TPZManVector(&local_3d40,(long)(int)(iVar6 - uVar7),(int *)&local_3920);
  if ((int)uVar7 < iVar6) {
    lVar12 = 0;
    do {
      iVar8 = pztopology::TPZLine::ContainedSideLocId(side,uVar7 + (int)lVar12);
      iVar8 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeLinear>).
                                     super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                     super_TPZCompEl + 0x338))(this,iVar8);
      local_3d40.super_TPZVec<int>.fStore[lVar12] = iVar8;
      lVar12 = lVar12 + 1;
    } while ((uVar7 - iVar6) + (int)lVar12 != 0);
  }
  local_3920._0_8_ = 0;
  TPZManVector<long,_2>::TPZManVector(&local_3d70,(long)(int)uVar7,(long *)&local_3920);
  this_01 = TPZCompEl::Reference((TPZCompEl *)this);
  if (0 < (int)uVar7) {
    uVar10 = 0;
    do {
      iVar6 = pztopology::TPZLine::ContainedSideLocId(side,(int)uVar10);
      pTVar9 = TPZGeoEl::NodePtr(this_01,iVar6);
      local_3d70.super_TPZVec<long>.fStore[uVar10] = (long)pTVar9->fId;
      uVar10 = uVar10 + 1;
    } while (uVar7 != uVar10);
  }
  TPZShapeData::TPZShapeData(&local_3920);
  if (MVar4 == EOned) {
    TPZShapeHCurl<pzshape::TPZShapeLinear>::Initialize
              (&local_3d70.super_TPZVec<long>,&local_3d40.super_TPZVec<int>,&local_3920);
    iVar6 = TPZShapeHCurl<pzshape::TPZShapeLinear>::NHCurlShapeF(&local_3920);
    local_3d10 = 1;
    bVar1 = true;
  }
  else {
    if (MVar4 == ETriangle) {
      TPZShapeHCurl<pzshape::TPZShapeTriang>::Initialize
                (&local_3d70.super_TPZVec<long>,&local_3d40.super_TPZVec<int>,&local_3920);
      iVar6 = TPZShapeHCurl<pzshape::TPZShapeTriang>::NHCurlShapeF(&local_3920);
    }
    else {
      if (MVar4 != EQuadrilateral) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "virtual void TPZCompElHCurl<pzshape::TPZShapeLinear>::SideShapeFunction(int, TPZVec<REAL> &, TPZFMatrix<REAL> &, TPZFMatrix<REAL> &) [TSHAPE = pzshape::TPZShapeLinear]"
                   ,0xa7);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"\n invalid side type.Aborting...\n",0x20);
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/TPZCompElHCurl.cpp"
                   ,0x225);
      }
      TPZShapeHCurl<pzshape::TPZShapeQuad>::Initialize
                (&local_3d70.super_TPZVec<long>,&local_3d40.super_TPZVec<int>,&local_3920);
      iVar6 = TPZShapeHCurl<pzshape::TPZShapeQuad>::NHCurlShapeF(&local_3920);
    }
    local_3d10 = 2;
    bVar1 = false;
  }
  iVar8 = (int)local_3d10;
  lVar12 = (long)iVar6;
  local_3c50.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_3c50.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_3c50.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0183c898;
  local_3c50.fElem = (double *)0x0;
  local_3c50.fGiven = (double *)0x0;
  local_3c50.fSize = 0;
  local_3c50.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = (long)iVar8;
  local_3c50.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar12;
  TPZVec<int>::TPZVec(&local_3c50.fPivot.super_TPZVec<int>,0);
  local_3c50.fPivot.super_TPZVec<int>.fStore = local_3c50.fPivot.fExtAlloc;
  local_3c50.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_3c50.fPivot.super_TPZVec<int>.fNElements = 0;
  local_3c50.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_3c50.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_3c50.fWork.fStore = (double *)0x0;
  local_3c50.fWork.fNElements = 0;
  local_3c50.fWork.fNAlloc = 0;
  if (iVar6 != 0) {
    uVar14 = iVar8 * lVar12;
    uVar10 = 0xffffffffffffffff;
    if (uVar14 < 0x2000000000000000) {
      uVar10 = uVar14 * 8;
    }
    local_3c50.fElem = (double *)operator_new__(uVar10);
  }
  lVar11 = 1;
  if (!bVar1) {
    lVar11 = (long)((int)local_3d10 * 2 + -3);
  }
  local_3ce0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_3ce0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_3ce0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0183c898;
  local_3ce0.fElem = (double *)0x0;
  local_3ce0.fGiven = (double *)0x0;
  local_3ce0.fSize = 0;
  local_3ce0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = lVar11;
  local_3ce0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar12;
  TPZVec<int>::TPZVec(&local_3ce0.fPivot.super_TPZVec<int>,0);
  local_3ce0.fPivot.super_TPZVec<int>.fStore = local_3ce0.fPivot.fExtAlloc;
  local_3ce0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_3ce0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_3ce0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_3ce0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_3ce0.fWork.fStore = (double *)0x0;
  local_3ce0.fWork.fNElements = 0;
  local_3ce0.fWork.fNAlloc = 0;
  if (iVar6 != 0) {
    uVar10 = 0xffffffffffffffff;
    if ((ulong)(lVar11 * lVar12) < 0x2000000000000000) {
      uVar10 = lVar11 * lVar12 * 8;
    }
    local_3ce0.fElem = (double *)operator_new__(uVar10);
  }
  if (MVar4 == EOned) {
    TPZShapeHCurl<pzshape::TPZShapeLinear>::Shape(point,&local_3920,&local_3c50,&local_3ce0);
  }
  else if (MVar4 == ETriangle) {
    TPZShapeHCurl<pzshape::TPZShapeTriang>::Shape(point,&local_3920,&local_3c50,&local_3ce0);
  }
  else {
    if (MVar4 != EQuadrilateral) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "virtual void TPZCompElHCurl<pzshape::TPZShapeLinear>::SideShapeFunction(int, TPZVec<REAL> &, TPZFMatrix<REAL> &, TPZFMatrix<REAL> &) [TSHAPE = pzshape::TPZShapeLinear]"
                 ,0xa7);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"\n invalid side type.Aborting...\n",0x20);
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/TPZCompElHCurl.cpp"
                 ,0x23f);
    }
    TPZShapeHCurl<pzshape::TPZShapeQuad>::Shape(point,&local_3920,&local_3c50,&local_3ce0);
  }
  local_3cf8.fGeoEl = TPZCompEl::Reference((TPZCompEl *)this);
  local_3cf8.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_01920090;
  lVar13 = (long)iVar3;
  local_3ae0.fElem = local_3a50;
  local_3ae0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_3ae0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_3ae0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0183dbe0;
  local_3ae0.fSize = 9;
  local_3cf8.fSide = side;
  local_3ae0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = lVar13;
  local_3ae0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar13;
  local_3ae0.fGiven = local_3ae0.fElem;
  TPZVec<int>::TPZVec(&local_3ae0.fPivot.super_TPZVec<int>,0);
  local_3ae0.fPivot.super_TPZVec<int>.fStore = local_3ae0.fPivot.fExtAlloc;
  local_3ae0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_3ae0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_3ae0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_3ae0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_3ae0.fWork.fStore = (double *)0x0;
  local_3ae0.fWork.fNElements = 0;
  local_3ae0.fWork.fNAlloc = 0;
  uVar10 = lVar13 * lVar13;
  if (iVar3 == 0) {
    local_3ae0.fElem = (double *)0x0;
  }
  else if (9 < uVar10) {
    uVar14 = 0xffffffffffffffff;
    if (uVar10 < 0x2000000000000000) {
      uVar14 = uVar10 * 8;
    }
    local_3ae0.fElem = (double *)operator_new__(uVar14);
  }
  local_3ae0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_0183d8f0;
  local_3bc0.fElem = local_3b30;
  local_3bc0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_3bc0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_3bc0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0183dbe0;
  local_3bc0.fSize = 9;
  local_3bc0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = lVar13;
  local_3bc0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar13;
  local_3bc0.fGiven = local_3bc0.fElem;
  TPZVec<int>::TPZVec(&local_3bc0.fPivot.super_TPZVec<int>,0);
  local_3bc0.fPivot.super_TPZVec<int>.fStore = local_3bc0.fPivot.fExtAlloc;
  local_3bc0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_3bc0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_3bc0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_3bc0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_3bc0.fWork.fStore = (double *)0x0;
  local_3bc0.fWork.fNElements = 0;
  local_3bc0.fWork.fNAlloc = 0;
  if (iVar3 == 0) {
    local_3bc0.fElem = (double *)0x0;
  }
  else if (9 < uVar10) {
    uVar14 = 0xffffffffffffffff;
    if (uVar10 < 0x2000000000000000) {
      uVar14 = uVar10 * 8;
    }
    local_3bc0.fElem = (double *)operator_new__(uVar14);
  }
  local_3bc0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_0183d8f0;
  local_3a00.fElem = local_3970;
  local_3a00.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 3;
  local_3a00.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_3a00.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_3a00.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0183dbe0;
  local_3a00.fSize = 9;
  local_3a00.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = lVar13;
  local_3a00.fGiven = local_3a00.fElem;
  TPZVec<int>::TPZVec(&local_3a00.fPivot.super_TPZVec<int>,0);
  local_3a00.fPivot.super_TPZVec<int>.fStore = local_3a00.fPivot.fExtAlloc;
  local_3a00.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_3a00.fPivot.super_TPZVec<int>.fNElements = 0;
  local_3a00.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_3a00.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_3a00.fWork.fStore = (double *)0x0;
  local_3a00.fWork.fNElements = 0;
  local_3a00.fWork.fNAlloc = 0;
  if (iVar3 == 0) {
    local_3a00.fElem = (double *)0x0;
  }
  else if (3 < iVar3) {
    uVar10 = 0xffffffffffffffff;
    if ((ulong)(lVar13 * 3) < 0x2000000000000000) {
      uVar10 = lVar13 * 0x18;
    }
    local_3a00.fElem = (double *)operator_new__(uVar10);
  }
  local_3a00.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_0183d8f0;
  local_3d78 = 0.0;
  TPZGeoElSide::Jacobian(&local_3cf8,point,&local_3ae0,&local_3a00,&local_3d78,&local_3bc0);
  this_00 = local_3d00;
  phi_00 = local_3d08;
  (*(local_3d08->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xe]
  )(local_3d08,lVar12,3);
  (*(this_00->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xe])
            (this_00,lVar11,lVar12);
  TransformShape(&local_3c50,local_3d78,&local_3bc0,&local_3a00,phi_00);
  RVar2 = local_3d78;
  if (iVar3 == 1) {
    TPZFMatrix<double>::operator=(this_00,&local_3ce0);
  }
  else {
    if (iVar3 != 2) {
      if (iVar3 == 3) {
        TransformCurl<3>(&local_3ce0,local_3d78,&local_3ae0,this_00);
      }
      goto LAB_01227968;
    }
    TPZFMatrix<double>::operator=(this_00,&local_3ce0);
  }
  (*(this_00->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x26])
            (1.0 / RVar2,this_00);
LAB_01227968:
  TPZFMatrix<double>::~TPZFMatrix(&local_3a00,&PTR_PTR_0183dba8);
  TPZFMatrix<double>::~TPZFMatrix(&local_3bc0,&PTR_PTR_0183dba8);
  TPZFMatrix<double>::~TPZFMatrix(&local_3ae0,&PTR_PTR_0183dba8);
  TPZFMatrix<double>::~TPZFMatrix(&local_3ce0);
  TPZFMatrix<double>::~TPZFMatrix(&local_3c50);
  TPZShapeData::~TPZShapeData(&local_3920,&TPZShapeData::VTT);
  if (local_3d70.super_TPZVec<long>.fStore == local_3d70.fExtAlloc) {
    local_3d70.super_TPZVec<long>.fStore = (long *)0x0;
  }
  local_3d70.super_TPZVec<long>.fNAlloc = 0;
  local_3d70.super_TPZVec<long>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5f0;
  if (local_3d70.super_TPZVec<long>.fStore != (long *)0x0) {
    operator_delete__(local_3d70.super_TPZVec<long>.fStore);
  }
  if (local_3d40.super_TPZVec<int>.fStore == local_3d40.fExtAlloc) {
    local_3d40.super_TPZVec<int>.fStore = (int *)0x0;
  }
  local_3d40.super_TPZVec<int>.fNAlloc = 0;
  local_3d40.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
  if (local_3d40.super_TPZVec<int>.fStore != (int *)0x0) {
    operator_delete__(local_3d40.super_TPZVec<int>.fStore);
  }
  return;
}

Assistant:

void TPZCompElHCurl<TSHAPE>::SideShapeFunction(int side,TPZVec<REAL> &point,TPZFMatrix<REAL> &phi,TPZFMatrix<REAL> &curlphi)
{
    constexpr int dim = TSHAPE::Dimension;
    const int sideDim = TSHAPE::SideDimension(side);
    const MElementType sidetype = TSHAPE::Type(side);
#ifdef PZDEBUG
    if(side >= TSHAPE::NSides || side < TSHAPE::NCornerNodes){
        PZError<<__PRETTY_FUNCTION__<<"\n";
        PZError<<"There is no side shape associated to this side"<<"\n";
        DebugStop();
    }
	if( sideDim != point.size() ){
        PZError<<__PRETTY_FUNCTION__<<"\n";
        PZError<<"Wrong dimension of point! point dim: "<<point.size()<<"\tside dim: "<<sideDim<<"\n";
		return ;
	}
#endif

    const int connectLocalId = this->MidSideConnectLocId(side);
    const int connectOrder = this->Connect(connectLocalId).Order();
    const int nContainedSides = TSHAPE::NContainedSides(side);
    const int nSideNodes = TSHAPE::NSideNodes(side);
    const int nSideConnects = nContainedSides - nSideNodes;
    //vector with the connect order for each side of dim >=1 contained in side
    TPZManVector<int,TSHAPE::NSides> ordHCurl(nSideConnects,-1);
    for (auto is=nSideNodes; is< nContainedSides; is++) {
        const int subSide = TSHAPE::ContainedSideLocId(side,is);
        ordHCurl[is-nSideNodes] = this->EffectiveSideOrder(subSide);
    }
    
    TPZManVector<int64_t,TSHAPE::NCornerNodes> ids(nSideNodes,0);
    TPZGeoEl *ref = this->Reference();
    for (auto is=0; is< nSideNodes; is++) {
        const int subSide = TSHAPE::ContainedSideLocId(side,is);
        ids[is] = ref->NodePtr(subSide)->Id();
    }

    TPZShapeData shapedata;

    
    int sidedim{-1};
    int nshape{-1};
    switch(sidetype){
    case EOned:
        TPZShapeHCurl<pzshape::TPZShapeLinear>::Initialize(ids,ordHCurl,shapedata);
        nshape = TPZShapeHCurl<pzshape::TPZShapeLinear>::NHCurlShapeF(shapedata);
        sidedim = 1;
        break;
    case ETriangle:
        TPZShapeHCurl<pzshape::TPZShapeTriang>::Initialize(ids,ordHCurl,shapedata);
        nshape = TPZShapeHCurl<pzshape::TPZShapeTriang>::NHCurlShapeF(shapedata);
        sidedim = 2;
        break;
    case EQuadrilateral:
        TPZShapeHCurl<pzshape::TPZShapeQuad>::Initialize(ids,ordHCurl,shapedata);
        nshape = TPZShapeHCurl<pzshape::TPZShapeQuad>::NHCurlShapeF(shapedata);
        sidedim = 2;
        break;
    default:
        PZError<<__PRETTY_FUNCTION__
               <<"\n invalid side type.Aborting...\n";
        DebugStop();
    }

    const int curldim = [sidedim](){
        if (sidedim == 1) return 1;
        else{
            return 2*sidedim - 3;//1 for 2D 3 for 3D
        }
    }();
    
    TPZFMatrix<REAL> phiref(sidedim,nshape);
    TPZFMatrix<REAL> curlphiref(curldim,nshape);
    
    switch(sidetype){
    case EOned:
        TPZShapeHCurl<pzshape::TPZShapeLinear>::Shape(point, shapedata, phiref, curlphiref);
        break;
    case ETriangle:
        TPZShapeHCurl<pzshape::TPZShapeTriang>::Shape(point, shapedata, phiref, curlphiref);
        break;
    case EQuadrilateral:
        TPZShapeHCurl<pzshape::TPZShapeQuad>::Shape(point, shapedata, phiref, curlphiref);
        break;
    default:
        PZError<<__PRETTY_FUNCTION__
               <<"\n invalid side type.Aborting...\n";
        DebugStop();
    }

    //get the jacobian of the side transformation
    TPZGeoElSide gelside = TPZGeoElSide(this->Reference(),side);
    TPZFNMatrix<9,REAL> jac(sideDim,sideDim),jacinv(sideDim,sideDim),axes(sideDim,3);
    REAL detjac = 0;
    gelside.Jacobian(point, jac, axes, detjac, jacinv);


    phi.Redim(nshape,3);
    curlphi.Redim(curldim,nshape);
    
    TransformShape(phiref, detjac, jacinv, axes, phi);
    switch(sideDim){
    case 1:
        TransformCurl<1>(curlphiref, detjac, jac, curlphi);
        break;
    case 2:
        TransformCurl<2>(curlphiref, detjac, jac, curlphi);
        break;
    case 3:
        TransformCurl<3>(curlphiref, detjac, jac, curlphi);
        break;
    }
    
    
}